

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

bool nivalis::anon_unknown_10::parse_polyline_expr
               (string *expr_str,Function *func,Environment *env,int x_var,int y_var,int t_var,
               string *parse_err)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  size_type sVar8;
  long in_RSI;
  ulong in_RDI;
  string *in_stack_00000008;
  Expr *e1_2;
  iterator __end3;
  iterator __begin3;
  vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *__range3;
  Expr e1_1;
  string s_1;
  string tmp_err_1;
  Expr e1;
  string s;
  string tmp_err;
  char c;
  size_t i;
  bool is_polyline_type;
  bool want_reparse;
  bool has_comma;
  size_t stkh;
  size_t last_begin;
  string *in_stack_fffffffffffffe18;
  Expr *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe60;
  __normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
  local_198;
  long local_190;
  string local_188 [80];
  string local_138 [24];
  size_t in_stack_fffffffffffffee0;
  string local_118 [6];
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  Environment *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string local_f8 [8];
  string *in_stack_ffffffffffffff10;
  string local_98 [32];
  string local_78 [39];
  char local_51;
  ulong local_50;
  byte local_43;
  byte local_42;
  byte local_41;
  long local_40;
  long local_38;
  long local_18;
  ulong local_10;
  
  local_38 = 0;
  local_40 = 0;
  local_41 = 0;
  local_42 = 0;
  local_43 = (*(uint *)(in_RSI + 0x70) & 0xfffffff8) == 0x80;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_50 = 0; uVar7 = local_50, uVar4 = std::__cxx11::string::size(), uVar7 < uVar4;
      local_50 = local_50 + 1) {
    pcVar5 = (char *)std::__cxx11::string::operator[](local_10);
    local_51 = *pcVar5;
    iVar3 = isspace((int)local_51);
    if (iVar3 == 0) {
      bVar2 = util::is_open_bracket(local_51);
      if (bVar2) {
        local_40 = local_40 + 1;
      }
      else {
        bVar2 = util::is_close_bracket(local_51);
        if (bVar2) {
          local_40 = local_40 + -1;
        }
      }
      iVar3 = (int)local_51;
      if (iVar3 == 0x28) {
        if (local_40 == 1) {
          local_38 = local_50 + 1;
        }
      }
      else if (iVar3 == 0x29) {
        if (local_40 == 0) {
          if ((local_41 & 1) == 0) {
            std::__cxx11::string::append((char *)in_stack_00000008);
            return false;
          }
          std::__cxx11::string::string(local_118);
          std::__cxx11::string::substr((ulong)local_138,local_10);
          in_stack_fffffffffffffe18 = local_118;
          parse(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef,
                (bool)in_stack_fffffffffffffeee,in_stack_fffffffffffffee0,in_stack_ffffffffffffff10)
          ;
          util::rtrim(in_stack_fffffffffffffe60);
          if (((local_43 & 1) == 0) || (lVar6 = std::__cxx11::string::size(), lVar6 == 0)) {
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back
                      (in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
            if ((local_43 & 1) == 0) {
              in_stack_fffffffffffffe28 = in_stack_00000008;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(iVar3,in_stack_fffffffffffffe48),in_stack_fffffffffffffe40);
              std::__cxx11::string::append(in_stack_fffffffffffffe28);
              std::__cxx11::string::~string(local_188);
            }
          }
          else {
            in_stack_fffffffffffffe30 =
                 (vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)(local_18 + 0x118);
            in_stack_fffffffffffffe18 = in_stack_00000008;
            parse(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                  (bool)in_stack_fffffffffffffeef,(bool)in_stack_fffffffffffffeee,
                  in_stack_fffffffffffffee0,in_stack_ffffffffffffff10);
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back
                      ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)
                       in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
            Expr::~Expr((Expr *)0x1405b3);
            local_42 = 1;
          }
          local_41 = 0;
          Expr::~Expr((Expr *)0x1406d5);
          std::__cxx11::string::~string(local_138);
          std::__cxx11::string::~string(local_118);
        }
      }
      else if (iVar3 == 0x2c) {
        if (local_40 == 1) {
          std::__cxx11::string::string(local_78);
          std::__cxx11::string::substr((ulong)local_98,local_10);
          in_stack_fffffffffffffe18 = local_78;
          parse(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef,
                (bool)in_stack_fffffffffffffeee,in_stack_fffffffffffffee0,in_stack_ffffffffffffff10)
          ;
          util::rtrim(in_stack_fffffffffffffe60);
          if (((local_43 & 1) == 0) || (lVar6 = std::__cxx11::string::size(), lVar6 == 0)) {
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back
                      (in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
            psVar1 = in_stack_00000008;
            if ((local_43 & 1) == 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(iVar3,in_stack_fffffffffffffe48),in_stack_fffffffffffffe40);
              std::__cxx11::string::append(psVar1);
              std::__cxx11::string::~string(local_f8);
            }
          }
          else {
            in_stack_fffffffffffffe40 = (char *)(local_18 + 0x118);
            in_stack_fffffffffffffe18 = in_stack_00000008;
            parse(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                  (bool)in_stack_fffffffffffffeef,(bool)in_stack_fffffffffffffeee,
                  in_stack_fffffffffffffee0,in_stack_ffffffffffffff10);
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back
                      ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)
                       in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
            Expr::~Expr((Expr *)0x1402d8);
            local_42 = 1;
          }
          local_38 = local_50 + 1;
          local_41 = 1;
          Expr::~Expr((Expr *)0x14041a);
          std::__cxx11::string::~string(local_98);
          std::__cxx11::string::~string(local_78);
        }
      }
      else {
        iVar3 = isspace((int)local_51);
        if (((iVar3 == 0) && (local_51 != ',')) && (local_40 == 0)) {
          return false;
        }
      }
    }
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    local_190 = local_18 + 0x118;
    local_198._M_current =
         (Expr *)std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::begin
                           ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)
                            in_stack_fffffffffffffe18);
    std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::end
              ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)in_stack_fffffffffffffe18);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
                               *)in_stack_fffffffffffffe20,
                              (__normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
                               *)in_stack_fffffffffffffe18), bVar2) {
      __gnu_cxx::
      __normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
      ::operator*(&local_198);
      bVar2 = Expr::has_var(in_stack_fffffffffffffe20,
                            (uint32_t)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      if ((bVar2) ||
         (bVar2 = Expr::has_var(in_stack_fffffffffffffe20,
                                (uint32_t)((ulong)in_stack_fffffffffffffe18 >> 0x20)), bVar2)) {
        std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::clear
                  ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)0x140821);
        std::__cxx11::string::append((char *)in_stack_00000008);
        break;
      }
      if ((*(int *)(local_18 + 0x70) == 0x80) &&
         (bVar2 = Expr::has_var(in_stack_fffffffffffffe20,
                                (uint32_t)((ulong)in_stack_fffffffffffffe18 >> 0x20)), bVar2)) {
        sVar8 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                          ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)
                           (local_18 + 0x118));
        if (sVar8 != 2) {
          std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::clear
                    ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)0x140890);
          std::__cxx11::string::append((char *)in_stack_00000008);
          break;
        }
        *(undefined4 *)(local_18 + 0x70) = 0x28;
      }
      __gnu_cxx::
      __normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
      ::operator++(&local_198);
    }
  }
  return (bool)(local_42 & 1);
}

Assistant:

bool parse_polyline_expr(const std::string& expr_str, Function& func,
                         Environment& env, int x_var, int y_var, int t_var,
                         std::string& parse_err) {
    // Try to parse function as polyline expr
    size_t last_begin = 0, stkh = 0;
    bool has_comma = false;
    bool want_reparse = false;
    const bool is_polyline_type = ((func.type& ~Function::FUNC_TYPE_MOD_ALL)
                            == Function::FUNC_TYPE_GEOM_POLYLINE);
    for (size_t i = 0; i < expr_str.size(); ++i) {
        const char c = expr_str[i];
        if (std::isspace(c)) continue;
        // Handle nested brackets
        if (util::is_open_bracket(c)) ++stkh;
        else if (util::is_close_bracket(c)) --stkh;
        switch(c) {
            case '(':
                if (stkh == 1) {
                    last_begin = i + 1;
                }
                break;
            case ',':
                if (stkh == 1) {
                    std::string tmp_err,
                                s = expr_str.substr(last_begin,
                                        i - last_begin);
                    Expr e1 = parse(s, env,
                                true, true, 0, &tmp_err);
                    util::rtrim(tmp_err);
                    if (is_polyline_type && tmp_err.size()) {
                        func.exprs.push_back(parse(s, env,
                                    false, true, 0, &parse_err));
                        want_reparse = true;
                    } else {
                        func.exprs.push_back(e1);
                        if (!is_polyline_type) parse_err.append(tmp_err + "\n");
                    }
                    last_begin = i + 1;
                    has_comma = true;
                }
                break;
            case ')':
                if (stkh == 0) {
                    if (!has_comma) {
                        // Must have comma
                        parse_err.append("Polyline/parametric expression missing ,");
                        return false;
                    }
                    std::string tmp_err,
                                s = expr_str.substr(last_begin,
                                        i - last_begin);
                    Expr e1 = parse(s, env,
                                true, true, 0, &tmp_err);
                    util::rtrim(tmp_err);
                    if (is_polyline_type && tmp_err.size()) {
                        func.exprs.push_back(parse(s, env,
                                    false, true, 0, &parse_err));
                        want_reparse = true;
                    } else {
                        func.exprs.push_back(e1);
                        if (!is_polyline_type) parse_err.append(tmp_err + "\n");
                    }

                    has_comma = false;
                }
                break;
            default:
                // Can't have things between ), (
                // shouldn't happen since should not detect as polyline
                if (!std::isspace(c) && c != ',' && stkh == 0) return false;
        }
    }
    if (parse_err.empty()) {
        for (Expr& e1 : func.exprs) {
            if (e1.has_var(x_var) || e1.has_var(y_var)) {
                // Can't have x,y, show warning
                func.exprs.clear();
                parse_err.append("x, y disallowed in tuple "
                    "(polyline/parametric equation)\n");
                break;
            } else if (func.type == Function::FUNC_TYPE_GEOM_POLYLINE &&
                       e1.has_var(t_var)) {
                // Detect parametric equation
                if (func.exprs.size() != 2) {
                    func.exprs.clear();
                    parse_err.append("Parametric equation can't have "
                        "more than one tuple\n");
                    break;
                } else {
                    // Parametric detection: only single
                    // point and has t
                    func.type = Function::FUNC_TYPE_PARAMETRIC;
                }
            }
        }
    }
    return want_reparse;
}